

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O3

void visuals_cycler_set_cycle_for_race(monster_race *race,char *group_name,char *cycle_name)

{
  visuals_cycler *cycler;
  undefined4 in_EAX;
  int iVar1;
  visuals_color_cycle **ppvVar2;
  visuals_color_cycle *pvVar3;
  ulong uVar4;
  anon_struct_24_3_6ed953bc *paVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  
  cycler = visuals_cycler_table;
  auVar7._0_4_ = -(uint)(race == (monster_race *)0x0);
  auVar7._4_4_ = -(uint)(group_name == (char *)0x0);
  auVar7._8_4_ = -(uint)(cycle_name == (char *)0x0);
  auVar7._12_4_ = -(uint)(visuals_color_cycles_by_race == (anon_struct_24_3_6ed953bc *)0x0);
  iVar1 = movmskps(in_EAX,auVar7);
  if (iVar1 == 0) {
    uVar4 = (ulong)race->ridx;
    sVar6 = visuals_color_cycles_by_race->max_entries;
    paVar5 = visuals_color_cycles_by_race;
    if (sVar6 <= uVar4) {
      do {
        sVar6 = sVar6 + paVar5->alloc_size;
        ppvVar2 = (visuals_color_cycle **)mem_realloc(paVar5->race,sVar6 * 8);
        visuals_color_cycles_by_race->race = ppvVar2;
        paVar5 = visuals_color_cycles_by_race;
        visuals_color_cycles_by_race->max_entries = sVar6;
        if (9999 < sVar6) {
          quit("Allocated too many color cycle/race refs. Check monster info?");
          sVar6 = visuals_color_cycles_by_race->max_entries;
          paVar5 = visuals_color_cycles_by_race;
        }
        uVar4 = (ulong)race->ridx;
      } while (sVar6 <= uVar4);
    }
    pvVar3 = visuals_cycler_cycle_by_name(cycler,group_name,cycle_name);
    if (pvVar3 != (visuals_color_cycle *)0x0) {
      paVar5->race[uVar4] = pvVar3;
    }
  }
  return;
}

Assistant:

void visuals_cycler_set_cycle_for_race(struct monster_race const *race,
									   const char *group_name,
									   const char *cycle_name)
{
	struct visuals_cycler *table = visuals_cycler_table;
	struct visuals_color_cycle *cycle = NULL;

	if (race == NULL || group_name == NULL || cycle_name == NULL) {
		return;
	}

	if (visuals_color_cycles_by_race == NULL) {
		return;
	}

	while (race->ridx >= visuals_color_cycles_by_race->max_entries) {
		/* Keep reallocating until we can fit the index. This for the case when
		 * indexes may not be parsed in numerical order. */
		size_t old_count = visuals_color_cycles_by_race->max_entries;
		size_t new_count = old_count + visuals_color_cycles_by_race->alloc_size;
		size_t new_size = new_count * sizeof(*(visuals_color_cycles_by_race->race));
		visuals_color_cycles_by_race->race = mem_realloc(visuals_color_cycles_by_race->race, new_size);
		visuals_color_cycles_by_race->max_entries = new_count;

		if (new_count >= 10000) {
			/* Prevent the list from growing to a ridiculous size. */
			quit("Allocated too many color cycle/race refs. Check monster info?");
		}
	}

	cycle = visuals_cycler_cycle_by_name(table, group_name, cycle_name);

	if (cycle == NULL) {
		return;
	}

	visuals_color_cycles_by_race->race[race->ridx] = cycle;
}